

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void ParseEntity(TidyDocImpl *doc,GetTokenMode mode)

{
  Lexer *lexer_00;
  int iVar1;
  Bool BVar2;
  uint c_00;
  SPStatus SVar3;
  uint uVar4;
  int replaceMode;
  uint c1_1;
  SPStatus status;
  uint c1;
  Lexer *lexer;
  uint local_60;
  uint entver;
  uint startcol;
  uint ch;
  uint c;
  Bool preserveEntities;
  Bool isXml;
  Bool found;
  Bool semicolon;
  uint charRead;
  ENTState entState;
  uint start;
  ENTfn entFn [3];
  GetTokenMode mode_local;
  TidyDocImpl *doc_local;
  
  _entState = prvTidyIsNamechar;
  entFn[0] = prvTidyIsDigit;
  entFn[1] = IsDigitHex;
  semicolon = no;
  found = no;
  isXml = no;
  preserveEntities = no;
  c = (uint)(doc->config).value[0x67].v;
  ch = (uint)(doc->config).value[0x40].v;
  lexer._4_4_ = 0;
  lexer_00 = doc->lexer;
  charRead = lexer_00->lexsize - 1;
  local_60 = doc->docIn->curcol - 1;
  do {
    startcol = prvTidyReadChar(doc->docIn);
    if (startcol == 0xffffffff) {
LAB_00157341:
      lexer_00->lexbuf[lexer_00->lexsize] = '\0';
      iVar1 = prvTidytmbstrcmp(lexer_00->lexbuf + charRead,"&apos");
      if ((((iVar1 == 0) && ((int)(doc->config).value[100].v == 0)) && (lexer_00->isvoyager == no))
         && (((int)(doc->config).value[0x62].v == 0 &&
             (iVar1 = prvTidyHTMLVersion(doc), iVar1 != 0x20000)))) {
        prvTidyReportEntityError(doc,0x225,lexer_00->lexbuf + charRead,0x27);
      }
      if ((mode == OtherNamespace) && (startcol == 0x3b)) {
        preserveEntities = yes;
        entver = 0xff;
        lexer._4_4_ = 0x60000;
        ch = 1;
      }
      else {
        preserveEntities =
             prvTidyEntityInfo(lexer_00->lexbuf + charRead,c,&entver,(uint *)((long)&lexer + 4));
      }
      if (((ch == 0) && (preserveEntities != no)) &&
         (BVar2 = prvTidyIsLowSurrogate(entver), BVar2 != no)) {
        c_00 = prvTidyReadChar(doc->docIn);
        uVar4 = entver;
        if (c_00 == 0x26) {
          SVar3 = GetSurrogatePair(doc,c,&entver);
          if (SVar3 == SP_error) {
            prvTidyReportSurrogateError(doc,0x230,uVar4,0);
            prvTidyUngetChar(0x26,doc->docIn);
          }
        }
        else {
          prvTidyUngetChar(c_00,doc->docIn);
          prvTidyReportSurrogateError(doc,0x230,entver,0);
          entver = 0xfffd;
        }
      }
      else if (((ch == 0) && (preserveEntities != no)) &&
              (BVar2 = prvTidyIsHighSurrogate(entver), BVar2 != no)) {
        prvTidyReportSurrogateError(doc,0x22e,entver,0);
        entver = 0xfffd;
      }
      if (((preserveEntities == no) || ((0x7f < entver && (entver < 0xa0)))) ||
         ((0xff < entver && (startcol != 0x3b)))) {
        SetLexerLocus(doc,lexer_00);
        lexer_00->columns = local_60;
        if (charRead + 1 < lexer_00->lexsize) {
          if ((entver < 0x80) || (0x9f < entver)) {
            prvTidyReportEntityError(doc,0x28d,lexer_00->lexbuf + charRead,entver);
          }
          else {
            uVar4 = prvTidyDecodeWin1252(entver);
            if (startcol != 0x3b) {
              prvTidyReportEntityError(doc,0x25f,lexer_00->lexbuf + charRead,startcol);
            }
            prvTidyReportEncodingError(doc,0x249,entver,(uint)(uVar4 == 0));
            if (uVar4 == 0) {
              lexer_00->lexsize = charRead;
            }
            else {
              lexer_00->lexsize = charRead;
              prvTidyAddCharToLexer(lexer_00,uVar4);
            }
            isXml = no;
          }
          if (isXml != no) {
            prvTidyAddCharToLexer(lexer_00,0x3b);
          }
        }
        else {
          iVar1 = prvTidyHTMLVersion(doc);
          if (iVar1 != 0x20000) {
            prvTidyReportEntityError(doc,0x282,lexer_00->lexbuf + charRead,entver);
          }
        }
      }
      else {
        if (startcol != 0x3b) {
          SetLexerLocus(doc,lexer_00);
          lexer_00->columns = local_60;
          prvTidyReportEntityError(doc,0x260,lexer_00->lexbuf + charRead,startcol);
        }
        if (ch == 0) {
          lexer_00->lexsize = charRead;
          if ((entver == 0xa0) && (mode == Preformatted)) {
            entver = 0x20;
          }
          prvTidyAddCharToLexer(lexer_00,entver);
          if ((entver == 0x26) && ((int)(doc->config).value[0x45].v == 0)) {
            AddStringToLexer(lexer_00,anon_var_dwarf_40466 + 0x2b);
          }
        }
        else {
          prvTidyAddCharToLexer(lexer_00,0x3b);
        }
        prvTidyConstrainVersion(doc,lexer._4_4_);
      }
      return;
    }
    if (startcol == 0x3b) {
      isXml = yes;
      goto LAB_00157341;
    }
    found = found + yes;
    if ((found == yes) && (startcol == 0x23)) {
      if ((((int)(doc->config).value[0x38].v == 0) || ((doc->config).value[0x22].v == 0xc)) ||
         ((doc->config).value[0x22].v == 0xd)) {
        prvTidyUngetChar(0x23,doc->docIn);
        return;
      }
      prvTidyAddCharToLexer(lexer_00,0x23);
      semicolon = yes;
    }
    else if (((found == 2) && (semicolon == yes)) &&
            ((startcol == 0x78 || ((c == 0 && (startcol == 0x58)))))) {
      prvTidyAddCharToLexer(lexer_00,startcol);
      semicolon = 2;
    }
    else {
      iVar1 = (**(code **)(&entState + (ulong)semicolon * 2))(startcol);
      if (iVar1 == 0) {
        prvTidyUngetChar(startcol,doc->docIn);
        goto LAB_00157341;
      }
      prvTidyAddCharToLexer(lexer_00,startcol);
    }
  } while( true );
}

Assistant:

static void ParseEntity( TidyDocImpl* doc, GetTokenMode mode )
{
    typedef enum
    {
        ENT_default,
        ENT_numdec,
        ENT_numhex
    } ENTState;
    
    typedef Bool (*ENTfn)(uint);
    const ENTfn entFn[] = {
        TY_(IsNamechar),
        TY_(IsDigit),
        IsDigitHex
    };
    uint start;
    ENTState entState = ENT_default;
    uint charRead = 0;
    Bool semicolon = no, found = no;
    Bool isXml = cfgBool( doc, TidyXmlTags );
    Bool preserveEntities = cfgBool( doc, TidyPreserveEntities );
    uint c, ch, startcol, entver = 0;
    Lexer* lexer = doc->lexer;

    start = lexer->lexsize - 1;  /* to start at "&" */
    startcol = doc->docIn->curcol - 1;

    while ( (c = TY_(ReadChar)(doc->docIn)) != EndOfStream )
    {
        if ( c == ';' )
        {
            semicolon = yes;
            break;
        }
        ++charRead;

        if (charRead == 1 && c == '#')
        {
            if ( !cfgBool(doc, TidyNCR) ||
                 cfg(doc, TidyInCharEncoding) == BIG5 ||
                 cfg(doc, TidyInCharEncoding) == SHIFTJIS )
            {
                TY_(UngetChar)('#', doc->docIn);
                return;
            }

            TY_(AddCharToLexer)( lexer, c );
            entState = ENT_numdec;
            continue;
        }
        else if (charRead == 2 && entState == ENT_numdec
                 && (c == 'x' || (!isXml && c == 'X')) )
        {
            TY_(AddCharToLexer)( lexer, c );
            entState = ENT_numhex;
            continue;
        }

        if ( entFn[entState](c) )
        {
            TY_(AddCharToLexer)( lexer, c );
            continue;
        }

        /* otherwise put it back */
        TY_(UngetChar)( c, doc->docIn );
        break;
    }

    /* make sure entity is NULL terminated */
    lexer->lexbuf[lexer->lexsize] = '\0';

    /* Should contrain version to XML/XHTML if &apos; 
    ** is encountered.  But this is not possible with
    ** Tidy's content model bit mask.
    */
    if ( TY_(tmbstrcmp)(lexer->lexbuf+start, "&apos") == 0
         && !cfgBool(doc, TidyXmlOut)
         && !lexer->isvoyager
         && !cfgBool(doc, TidyXhtmlOut)
         && !(TY_(HTMLVersion)(doc) == HT50) ) /* Issue #239 - no warning if in HTML5++ mode */
        TY_(ReportEntityError)( doc, APOS_UNDEFINED, lexer->lexbuf+start, 39 );

    if (( mode == OtherNamespace ) && ( c == ';' ))
    {
        /* #130 MathML attr and entity fix! */
        found = yes;
        ch = 255;
        entver = XH50|HT50;
        preserveEntities = yes;
    }
    else
    {
        /* Lookup entity code and version
        */
        found = TY_(EntityInfo)( lexer->lexbuf+start, isXml, &ch, &entver );
    }

    /* Issue #483 - Deal with 'surrogate pairs' */
    /* TODO: Maybe warning/error, like found a leading surrogate
       but no following surrogate! Maybe should avoid outputting
       invalid utf-8 for this entity - maybe substitute?  */
    if (!preserveEntities && found && TY_(IsLowSurrogate)(ch))
    {
        uint c1;
        if ((c1 = TY_(ReadChar)(doc->docIn)) == '&')
        {
            SPStatus status;
            /* Have a following entity, 
               so there is a chance of having a valid surrogate pair */
            c1 = ch;    /* keep first value, in case of error */
            status = GetSurrogatePair(doc, isXml, &ch);
            if (status == SP_error)
            {
                TY_(ReportSurrogateError)(doc, BAD_SURROGATE_TAIL, c1, 0); /* SP WARNING: - using substitute character */
                TY_(UngetChar)('&', doc->docIn);  /* otherwise put it back */
            }
        }
        else
        {
            /* put this non-entity lead char back */
            TY_(UngetChar)(c1, doc->docIn);
            /* Have leading surrogate pair, with no tail */
            TY_(ReportSurrogateError)(doc, BAD_SURROGATE_TAIL, ch, 0); /* SP WARNING: - using substitute character */
            ch = 0xFFFD;
        }
    } 
    else if (!preserveEntities && found && TY_(IsHighSurrogate)(ch))
    {
        /* Have trailing surrogate pair, with no lead */
        TY_(ReportSurrogateError)(doc, BAD_SURROGATE_LEAD, ch, 0); /* SP WARNING: - using substitute character */
        ch = 0xFFFD;
    }

    /* deal with unrecognized or invalid entities */
    /* #433012 - fix by Randy Waki 17 Feb 01 */
    /* report invalid NCR's - Terry Teague 01 Sep 01 */
    if ( !found || (ch >= 128 && ch <= 159) || (ch >= 256 && c != ';') )
    {
        /* set error position just before offending character */
        SetLexerLocus( doc, lexer );
        lexer->columns = startcol;

        if (lexer->lexsize > start + 1)
        {
            if (ch >= 128 && ch <= 159)
            {
                /* invalid numeric character reference */
                
                uint c1 = 0;
                int replaceMode = DISCARDED_CHAR;
            
                /* Always assume Win1252 in this circumstance. */
                c1 = TY_(DecodeWin1252)( ch );

                if ( c1 )
                    replaceMode = REPLACED_CHAR;
                
                if ( c != ';' )  /* issue warning if not terminated by ';' */
                    TY_(ReportEntityError)( doc, MISSING_SEMICOLON_NCR,
                                            lexer->lexbuf+start, c );
 
                TY_(ReportEncodingError)(doc, INVALID_NCR, ch, replaceMode == DISCARDED_CHAR);
                
                if ( c1 )
                {
                    /* make the replacement */
                    lexer->lexsize = start;
                    TY_(AddCharToLexer)( lexer, c1 );
                    semicolon = no;
                }
                else
                {
                    /* discard */
                    lexer->lexsize = start;
                    semicolon = no;
               }
               
            }
            else
                TY_(ReportEntityError)( doc, UNKNOWN_ENTITY,
                                        lexer->lexbuf+start, ch );

            if (semicolon)
                TY_(AddCharToLexer)( lexer, ';' );
        }
        else
        {
            /*\ 
             *  Issue #207 - A naked & is allowed in HTML5, as an unambiguous ampersand!
            \*/
            if (TY_(HTMLVersion)(doc) != HT50) 
            {
                TY_(ReportEntityError)( doc, UNESCAPED_AMPERSAND,
                                    lexer->lexbuf+start, ch );
            }
        }
    }
    else
    {
        if ( c != ';' )    /* issue warning if not terminated by ';' */
        {
            /* set error position just before offending chararcter */
            SetLexerLocus( doc, lexer );
            lexer->columns = startcol;
            TY_(ReportEntityError)( doc, MISSING_SEMICOLON, lexer->lexbuf+start, c );
        }

        if (preserveEntities)
            TY_(AddCharToLexer)( lexer, ';' );
        else
        {
            lexer->lexsize = start;
            if ( ch == 160 && (mode == Preformatted) )
                ch = ' ';
            TY_(AddCharToLexer)( lexer, ch );

            if ( ch == '&' && !cfgBool(doc, TidyQuoteAmpersand) )
                AddStringToLexer( lexer, "amp;" );
        }

        /* Detect extended vs. basic entities */
        TY_(ConstrainVersion)( doc, entver );
    }
}